

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O3

Validity * __thiscall
kj::TestRunner::setFilter(Validity *__return_storage_ptr__,TestRunner *this,StringPtr pattern)

{
  char *__nptr;
  char *pcVar1;
  uint *puVar2;
  RemoveConst<unsigned_int> *pRVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar8;
  char *value;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  bool bVar15;
  StringPtr name;
  GlobFilter filter;
  GlobFilter local_78;
  char *local_38;
  ulong uVar7;
  
  value = pattern.content.ptr;
  this->hasFilter = true;
  sVar13 = pattern.content.size_ - 1;
  pcVar11 = value + pattern.content.size_;
  sVar14 = sVar13;
  do {
    bVar15 = sVar14 == 0;
    sVar14 = sVar14 - 1;
    if (bVar15) {
      uVar9 = 0;
      uVar10 = 0xffffffff;
      goto LAB_0032af4f;
    }
    __nptr = pcVar11 + -1;
    pcVar1 = pcVar11 + -2;
    pcVar11 = __nptr;
  } while (*pcVar1 != ':');
  local_38 = value;
  uVar6 = strtoul(__nptr,(char **)&local_78,0);
  if (__nptr != local_78.pattern.content.ptr) {
    uVar5 = (uint)uVar6;
    if (*local_78.pattern.content.ptr == '\0') {
LAB_0032af32:
      value = local_38;
      sVar13 = sVar14;
      uVar9 = (uint)uVar6;
      uVar10 = uVar5;
      goto LAB_0032af4f;
    }
    if (*local_78.pattern.content.ptr == '-') {
      pcVar11 = local_78.pattern.content.ptr + 1;
      uVar7 = strtoul(pcVar11,(char **)&local_78,0);
      uVar5 = (uint)uVar7;
      if (pcVar11 < local_78.pattern.content.ptr) {
        value = local_38;
        uVar9 = 0;
        uVar10 = 0xffffffff;
        if (*local_78.pattern.content.ptr != '\0') goto LAB_0032af4f;
        goto LAB_0032af32;
      }
    }
  }
  uVar9 = 0;
  uVar10 = 0xffffffff;
  value = local_38;
LAB_0032af4f:
  heapString(&local_78.pattern,value,sVar13);
  local_78.states.builder.ptr = (uint *)0x0;
  local_78.states.builder.pos = (RemoveConst<unsigned_int> *)0x0;
  local_78.states.builder.endPtr = (uint *)0x0;
  if ((anonymous_namespace)::testCasesHead == 0) {
    (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  }
  else {
    lVar12 = (anonymous_namespace)::testCasesHead;
    do {
      if (*(char *)(lVar12 + 0x30) == '\0') {
        pcVar11 = *(char **)(lVar12 + 8);
        sVar8 = strlen(pcVar11);
        name.content.size_ = sVar8 + 1;
        name.content.ptr = pcVar11;
        bVar15 = _::GlobFilter::matches(&local_78,name);
        if (((bVar15) && (uVar9 <= *(uint *)(lVar12 + 0x10))) &&
           (*(uint *)(lVar12 + 0x10) <= uVar10)) {
          *(undefined1 *)(lVar12 + 0x30) = 1;
        }
      }
      puVar4 = local_78.states.builder.endPtr;
      pRVar3 = local_78.states.builder.pos;
      puVar2 = local_78.states.builder.ptr;
      lVar12 = *(long *)(lVar12 + 0x20);
    } while (lVar12 != 0);
    (__return_storage_ptr__->errorMessage).ptr.isSet = false;
    if (local_78.states.builder.ptr != (uint *)0x0) {
      local_78.states.builder.ptr = (uint *)0x0;
      local_78.states.builder.pos = (RemoveConst<unsigned_int> *)0x0;
      local_78.states.builder.endPtr = (uint *)0x0;
      (**(local_78.states.builder.disposer)->_vptr_ArrayDisposer)
                (local_78.states.builder.disposer,puVar2,4,(long)pRVar3 - (long)puVar2 >> 2,
                 (long)puVar4 - (long)puVar2 >> 2,0);
    }
  }
  sVar13 = local_78.pattern.content.size_;
  pcVar11 = local_78.pattern.content.ptr;
  if (local_78.pattern.content.ptr != (char *)0x0) {
    local_78.pattern.content.ptr = (char *)0x0;
    local_78.pattern.content.size_ = 0;
    (**(local_78.pattern.content.disposer)->_vptr_ArrayDisposer)
              (local_78.pattern.content.disposer,pcVar11,1,sVar13,sVar13,0);
  }
  return __return_storage_ptr__;
}

Assistant:

MainBuilder::Validity setFilter(StringPtr pattern) {
    hasFilter = true;
    ArrayPtr<const char> filePattern = pattern;
    uint minLine = kj::minValue;
    uint maxLine = kj::maxValue;

    KJ_IF_MAYBE(colonPos, pattern.findLast(':')) {
      char* end;
      StringPtr lineStr = pattern.slice(*colonPos + 1);

      bool parsedRange = false;
      minLine = strtoul(lineStr.cStr(), &end, 0);
      if (end != lineStr.begin()) {
        if (*end == '-') {
          // A range.
          const char* part2 = end + 1;
          maxLine = strtoul(part2, &end, 0);
          if (end > part2 && *end == '\0') {
            parsedRange = true;
          }
        } else if (*end == '\0') {
          parsedRange = true;
          maxLine = minLine;
        }
      }

      if (parsedRange) {
        // We have an exact line number.
        filePattern = pattern.slice(0, *colonPos);
      } else {
        // Can't parse as a number. Maybe the colon is part of a Windows path name or something.
        // Let's just keep it as part of the file pattern.
        minLine = kj::minValue;
        maxLine = kj::maxValue;
      }
    }

    _::GlobFilter filter(filePattern);

    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      if (!testCase->matchedFilter && filter.matches(testCase->file) &&
          testCase->line >= minLine && testCase->line <= maxLine) {
        testCase->matchedFilter = true;
      }
    }

    return true;
  }